

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteDescriptor
          (ReflectionClassGenerator *this,Printer *printer)

{
  FileDescriptor *pFVar1;
  FileDescriptor *descriptor;
  EnumDescriptor *extraout_RDX;
  EnumDescriptor *descriptor_00;
  EnumDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *descriptor_01;
  FieldDescriptor *extraout_RDX_02;
  Printer *pPVar2;
  char *text;
  int i_1;
  long lVar3;
  int i_2;
  int i;
  int iVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 local_98 [8];
  string base64;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Printer *local_38;
  
  io::Printer::Print<char[10],std::__cxx11::string,char[22],std::__cxx11::string>
            (printer,
             "#region Descriptor\n/// <summary>File descriptor for $file_name$</summary>\npublic static pbr::FileDescriptor Descriptor {\n  get { return descriptor; }\n}\nprivate static pbr::FileDescriptor descriptor;\n\nstatic $reflection_class_name$() {\n"
             ,(char (*) [10])"file_name",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this->file_,
             (char (*) [22])0x2a3ed6,&this->reflectionClassname_);
  google::protobuf::io::Printer::Indent();
  io::Printer::Print<>(printer,"byte[] descriptorData = global::System.Convert.FromBase64String(\n")
  ;
  google::protobuf::io::Printer::Indent();
  google::protobuf::io::Printer::Indent();
  io::Printer::Print<>(printer,"string.Concat(\n");
  local_38 = printer;
  google::protobuf::io::Printer::Indent();
  FileDescriptorToBase64_abi_cxx11_((string *)local_98,(csharp *)this->file_,descriptor);
  while (pPVar2 = local_38, (pointer)0x3c < base64._M_dataplus._M_p) {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)local_98);
    io::Printer::Print<char[7],std::__cxx11::string>
              (local_38,"\"$base64$\",\n",(char (*) [7])"base64",&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::substr((ulong)&local_58,(ulong)local_98);
    std::__cxx11::string::operator=((string *)local_98,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  io::Printer::Print<char[7],std::__cxx11::string>
            (local_38,"\"$base64$\"));\n",(char (*) [7])"base64",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>
            (pPVar2,"descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n");
  io::Printer::Print<>(pPVar2,"    new pbr::FileDescriptor[] { ");
  for (iVar4 = 0; iVar4 < *(int *)(this->file_ + 0x20); iVar4 = iVar4 + 1) {
    auVar7 = google::protobuf::FileDescriptor::dependency((int)this->file_);
    GetReflectionClassName_abi_cxx11_(&local_58,auVar7._0_8_,auVar7._8_8_);
    io::Printer::Print<char[27],std::__cxx11::string>
              (local_38,"$full_reflection_class_name$.Descriptor, ",
               (char (*) [27])"full_reflection_class_name",&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  io::Printer::Print<>(local_38,"},\n    new pbr::GeneratedClrTypeInfo(");
  if (*(int *)(this->file_ + 0x30) < 1) {
    text = "null, ";
  }
  else {
    io::Printer::Print<>(local_38,"new[] {");
    lVar5 = 0;
    descriptor_00 = extraout_RDX;
    for (lVar3 = 0; lVar3 < *(int *)(this->file_ + 0x30); lVar3 = lVar3 + 1) {
      GetClassName_abi_cxx11_
                (&local_58,(csharp *)(*(long *)(this->file_ + 0x70) + lVar5),descriptor_00);
      io::Printer::Print<char[10],std::__cxx11::string>
                (local_38,"typeof($type_name$), ",(char (*) [10])0x2a0828,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      lVar5 = lVar5 + 0x50;
      descriptor_00 = extraout_RDX_00;
    }
    text = "}, ";
  }
  io::Printer::Print<>(local_38,text);
  pFVar1 = this->file_;
  iVar4 = *(int *)(pFVar1 + 0x38);
  if (iVar4 < 1) {
    io::Printer::Print<>(local_38,"null, ");
  }
  else {
    base64.field_2._8_8_ = 0;
    lVar3 = 0;
    descriptor_01 = extraout_RDX_01;
    for (lVar5 = 0; lVar5 < iVar4; lVar5 = lVar5 + 1) {
      GetFullExtensionName_abi_cxx11_
                (&local_58,(csharp *)(*(long *)(pFVar1 + 0x80) + lVar3),descriptor_01);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (base64.field_2._M_local_buf + 8),&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      pFVar1 = this->file_;
      iVar4 = *(int *)(pFVar1 + 0x38);
      lVar3 = lVar3 + 0x98;
      descriptor_01 = extraout_RDX_02;
    }
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_58,(protobuf *)(base64.field_2._M_local_buf + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x2b2e84,(char *)(long)iVar4);
    io::Printer::Print<char[11],std::__cxx11::string>
              (local_38,"new pb::Extension[] { $extensions$ }, ",(char (*) [11])0x2c8b9b,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&base64.field_2 + 8));
  }
  pPVar2 = local_38;
  if (*(int *)(this->file_ + 0x2c) < 1) {
    io::Printer::Print<>(local_38,"null));\n");
  }
  else {
    io::Printer::Print<>(local_38,"new pbr::GeneratedClrTypeInfo[] {\n");
    google::protobuf::io::Printer::Indent();
    google::protobuf::io::Printer::Indent();
    google::protobuf::io::Printer::Indent();
    lVar3 = 0;
    uVar6 = 0;
    while( true ) {
      pPVar2 = local_38;
      iVar4 = *(int *)(this->file_ + 0x2c);
      if ((long)iVar4 <= (long)uVar6) break;
      WriteGeneratedCodeInfo
                (this,(Descriptor *)(*(long *)(this->file_ + 0x68) + lVar3),local_38,
                 uVar6 == iVar4 - 1);
      uVar6 = uVar6 + 1;
      lVar3 = lVar3 + 0x90;
    }
    google::protobuf::io::Printer::Outdent();
    io::Printer::Print<>(pPVar2,"\n}));\n");
    google::protobuf::io::Printer::Outdent();
    google::protobuf::io::Printer::Outdent();
  }
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>(pPVar2,"}\n");
  io::Printer::Print<>(pPVar2,"#endregion\n\n");
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

void ReflectionClassGenerator::WriteDescriptor(io::Printer* printer) {
  printer->Print(
    "#region Descriptor\n"
    "/// <summary>File descriptor for $file_name$</summary>\n"
    "public static pbr::FileDescriptor Descriptor {\n"
    "  get { return descriptor; }\n"
    "}\n"
    "private static pbr::FileDescriptor descriptor;\n"
    "\n"
    "static $reflection_class_name$() {\n",
    "file_name", file_->name(),
    "reflection_class_name", reflectionClassname_);
  printer->Indent();
  printer->Print(
    "byte[] descriptorData = global::System.Convert.FromBase64String(\n");
  printer->Indent();
  printer->Indent();
  printer->Print("string.Concat(\n");
  printer->Indent();

  // TODO(jonskeet): Consider a C#-escaping format here instead of just Base64.
  std::string base64 = FileDescriptorToBase64(file_);
  while (base64.size() > 60) {
    printer->Print("\"$base64$\",\n", "base64", base64.substr(0, 60));
    base64 = base64.substr(60);
  }
  printer->Print("\"$base64$\"));\n", "base64", base64);
  printer->Outdent();
  printer->Outdent();
  printer->Outdent();

  // -----------------------------------------------------------------
  // Invoke InternalBuildGeneratedFileFrom() to build the file.
  printer->Print(
      "descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n");
  printer->Print("    new pbr::FileDescriptor[] { ");
  for (int i = 0; i < file_->dependency_count(); i++) {
      printer->Print(
      "$full_reflection_class_name$.Descriptor, ",
      "full_reflection_class_name",
      GetReflectionClassName(file_->dependency(i)));
  }
  printer->Print("},\n"
      "    new pbr::GeneratedClrTypeInfo(");
  // Specify all the generated code information, recursively.
  if (file_->enum_type_count() > 0) {
      printer->Print("new[] {");
      for (int i = 0; i < file_->enum_type_count(); i++) {
          printer->Print("typeof($type_name$), ", "type_name", GetClassName(file_->enum_type(i)));
      }
      printer->Print("}, ");
  }
  else {
      printer->Print("null, ");
  }  
  if (file_->extension_count() > 0) {
    std::vector<std::string> extensions;
    for (int i = 0; i < file_->extension_count(); i++) {
      extensions.push_back(GetFullExtensionName(file_->extension(i)));
    }
    printer->Print("new pb::Extension[] { $extensions$ }, ", "extensions", Join(extensions, ", "));
  }
  else {
    printer->Print("null, ");
  }
  if (file_->message_type_count() > 0) {
      printer->Print("new pbr::GeneratedClrTypeInfo[] {\n");
      printer->Indent();
      printer->Indent();
      printer->Indent();
      for (int i = 0; i < file_->message_type_count(); i++) {
          WriteGeneratedCodeInfo(file_->message_type(i), printer, i == file_->message_type_count() - 1);
      }
      printer->Outdent();
      printer->Print("\n}));\n");
      printer->Outdent();
      printer->Outdent();
  }
  else {
      printer->Print("null));\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("#endregion\n\n");
}